

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O3

int __thiscall ncnn::Normalize::load_model(Normalize *this,ModelBin *mb)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  int iVar4;
  void *local_50;
  int *local_48;
  size_t local_40;
  Allocator *local_38;
  int local_30;
  int iStack_2c;
  int iStack_28;
  int iStack_24;
  size_t local_20;
  
  (**mb->_vptr_ModelBin)(&local_50,mb,(ulong)(uint)this->scale_data_size,1);
  if (&this->scale_data != (Mat *)&local_50) {
    if (local_48 != (int *)0x0) {
      LOCK();
      *local_48 = *local_48 + 1;
      UNLOCK();
    }
    piVar1 = (this->scale_data).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->scale_data).data;
        pAVar3 = (this->scale_data).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(*(void **)((long)pvVar2 + -8));
          }
        }
        else {
          (**(code **)(*(long *)pAVar3 + 8))();
        }
      }
    }
    (this->scale_data).data = local_50;
    (this->scale_data).refcount = local_48;
    (this->scale_data).elemsize = local_40;
    (this->scale_data).allocator = local_38;
    (this->scale_data).dims = local_30;
    (this->scale_data).w = iStack_2c;
    (this->scale_data).h = iStack_28;
    (this->scale_data).c = iStack_24;
    (this->scale_data).cstep = local_20;
  }
  if (local_48 != (int *)0x0) {
    LOCK();
    *local_48 = *local_48 + -1;
    UNLOCK();
    if (*local_48 == 0) {
      if (local_38 == (Allocator *)0x0) {
        if (local_50 != (void *)0x0) {
          free(*(void **)((long)local_50 + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_38 + 8))();
      }
    }
  }
  if (((this->scale_data).data == (void *)0x0) ||
     (iVar4 = 0, (long)(this->scale_data).c * (this->scale_data).cstep == 0)) {
    iVar4 = -100;
  }
  return iVar4;
}

Assistant:

int Normalize::load_model(const ModelBin& mb)
{
    scale_data = mb.load(scale_data_size, 1);
    if (scale_data.empty())
        return -100;

    return 0;
}